

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O0

double l1Norm_V(Vector *V)

{
  LASErrIdType LVar1;
  Real *VCmp;
  size_t Ind;
  size_t Dim;
  double Sum;
  double SRes;
  Vector *V_local;
  
  V_Lock(V);
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    Dim = 0;
    for (VCmp = (Real *)0x1; VCmp <= (Real *)V->Dim; VCmp = (Real *)((long)VCmp + 1)) {
      Dim = (size_t)(ABS(V->Cmp[(long)VCmp]) + (double)Dim);
    }
    Sum = V->Multipl * (double)Dim;
  }
  else {
    Sum = 1.0;
  }
  V_Unlock(V);
  return Sum;
}

Assistant:

double l1Norm_V(Vector *V)
/* SRes = l1-Norm of the vector V */
{
    double SRes;

    double Sum;
    size_t Dim, Ind;
    Real *VCmp;

    V_Lock(V);
    
    if (LASResult() == LASOK) {
        Dim = V->Dim;
        VCmp = V->Cmp;
        Sum = 0.0;
        for_AllCmp
           Sum += fabs(VCmp[Ind]);
        Sum *= V->Multipl;
        SRes = Sum;
    } else {
        SRes = 1.0;
    }

    V_Unlock(V);

    return(SRes);
}